

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

string * Catch::StringMaker<char_const*,void>::convert_abi_cxx11_(char *str)

{
  char *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  allocator local_45 [20];
  allocator local_31;
  string local_30 [48];
  
  if (in_RSI == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"{null string}",local_45);
    std::allocator<char>::~allocator((allocator<char> *)local_45);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,in_RSI,&local_31);
    Detail::stringify<std::__cxx11::string>(in_stack_ffffffffffffff88);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return in_RDI;
}

Assistant:

std::string StringMaker<char const*>::convert(char const* str) {
    if (str) {
        return ::Catch::Detail::stringify(std::string{ str });
    } else {
        return{ "{null string}" };
    }
}